

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

string * google::MakeCheckOpString<void_const*,void_const*>(void **v1,void **v2,char *exprtext)

{
  ostream *os;
  string *psVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_20;
  
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_20,exprtext);
  MakeCheckOpValueString<void_const*>((ostream *)local_20.stream_,v1);
  os = base::CheckOpMessageBuilder::ForVar2(&local_20);
  MakeCheckOpValueString<void_const*>(os,v2);
  psVar1 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_20);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_20);
  return psVar1;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2,
                               const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}